

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fq.cpp
# Opt level: O2

bool __thiscall zmq::fq_t::has_in(fq_t *this)

{
  bool bVar1;
  size_type sVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->_more == false) {
    sVar2 = this->_active;
    while (bVar3 = sVar2 != 0, bVar3) {
      bVar1 = pipe_t::check_read((this->_pipes)._items.
                                 super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[this->_current]);
      if (bVar1) {
        return bVar3;
      }
      sVar2 = this->_active - 1;
      this->_active = sVar2;
      array_t<zmq::pipe_t,_1>::swap(&this->_pipes,this->_current,sVar2);
      sVar2 = this->_active;
      if (this->_current == sVar2) {
        this->_current = 0;
      }
    }
  }
  return bVar3;
}

Assistant:

bool zmq::fq_t::has_in ()
{
    //  There are subsequent parts of the partly-read message available.
    if (_more)
        return true;

    //  Note that messing with current doesn't break the fairness of fair
    //  queueing algorithm. If there are no messages available current will
    //  get back to its original value. Otherwise it'll point to the first
    //  pipe holding messages, skipping only pipes with no messages available.
    while (_active > 0) {
        if (_pipes[_current]->check_read ())
            return true;

        //  Deactivate the pipe.
        _active--;
        _pipes.swap (_current, _active);
        if (_current == _active)
            _current = 0;
    }

    return false;
}